

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O3

void polygon_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  Am_Point_Array pts;
  Am_Style fs;
  Am_Style ls;
  Am_Point_List pl;
  Am_Point_Array local_68;
  Am_Style local_60;
  Am_Style local_58;
  Am_Point_List local_50;
  Am_Point_List local_40;
  
  pAVar5 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&local_58,pAVar5);
  pAVar5 = Am_Object::Get(self,0x6a,0);
  Am_Style::Am_Style(&local_60,pAVar5);
  pAVar5 = Am_Object::Get(self,0xb2,0);
  Am_Point_List::Am_Point_List(&local_40,pAVar5);
  Am_Point_List::Am_Point_List(&local_50,&local_40);
  Am_Point_Array::Am_Point_Array(&local_68,&local_50,x_offset,y_offset);
  Am_Point_List::~Am_Point_List(&local_50);
  pAVar5 = Am_Object::Get(self,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  (*drawonable->_vptr_Am_Drawonable[0x21])
            (drawonable,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),(ulong)uVar3
             ,(ulong)uVar4);
  (*drawonable->_vptr_Am_Drawonable[0x29])(drawonable,&local_58,&local_60,&local_68,7);
  (*drawonable->_vptr_Am_Drawonable[0x22])(drawonable);
  Am_Point_Array::~Am_Point_Array(&local_68);
  Am_Point_List::~Am_Point_List(&local_40);
  Am_Style::~Am_Style(&local_60);
  Am_Style::~Am_Style(&local_58);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, polygon_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  Am_Style ls = self.Get(Am_LINE_STYLE);
  Am_Style fs = self.Get(Am_FILL_STYLE);

  Am_Point_List pl = self.Get(Am_POINT_LIST);
  Am_Point_Array pts(pl, x_offset, y_offset);
  /// NDY: cache pts in a slot for faster drawing

  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  drawonable->Push_Clip(left + x_offset, top + y_offset, width, height);
  drawonable->Draw_Lines(ls, fs, pts, Am_DRAW_MASK_COPY);
  drawonable->Pop_Clip();
}